

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O0

void ParseOptionMenuBody(FScanner *sc,FOptionMenuDescriptor *desc)

{
  float step_00;
  bool bVar1;
  EColorRange cr_00;
  FOptionMenuItemSubmenu *this;
  FOptionMenuItemOption *this_00;
  char *graycheck;
  FOptionMenuItemCommand *this_01;
  FOptionMenuItemSafeCommand *this_02;
  FOptionMenuItemControl *this_03;
  FOptionMenuItemColorPicker *this_04;
  FOptionMenuItemStaticText *this_05;
  FOptionMenuItemStaticTextSwitchable *this_06;
  FOptionMenuSliderCVar *this_07;
  FOptionMenuScreenResolutionLine *this_08;
  FOptionMenuTextField *this_09;
  FOptionMenuNumberField *this_10;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  FKeyBindings *bindings;
  FOptionMenuNumberField *local_198;
  FOptionMenuItem *it_11;
  FString check_2;
  float local_180;
  float step_1;
  float maximum;
  float minimum;
  FString cvar_2;
  FString label_9;
  FOptionMenuItem *it_10;
  FString check_1;
  FString cvar_1;
  FString label_8;
  FOptionMenuItem *it_9;
  FOptionMenuItem *it_8;
  double dStack_130;
  int showvalue;
  double step;
  double max;
  double min;
  FString action_1;
  FString text;
  FOptionMenuItemStaticTextSwitchable *local_100;
  FOptionMenuItem *it_7;
  EColorRange cr_1;
  FName action;
  FString label2;
  FString label_7;
  FOptionMenuItem *it_6;
  EColorRange cr;
  FString label_6;
  FOptionMenuItem *it_5;
  FString label_5;
  FOptionMenuItem *it_4;
  FString label_4;
  FOptionMenuItemSafeCommand *pFStack_a0;
  bool map;
  FOptionMenuItem *it_3;
  FString prompt;
  FString command;
  FString label_3;
  FOptionMenuItem *it_2;
  FString label_2;
  FOptionMenuItem *it_1;
  int center;
  FString check;
  FString values;
  FString cvar;
  FString label_1;
  FOptionMenuItem *it;
  FString local_28;
  FString label;
  PClass *cls;
  FOptionMenuDescriptor *desc_local;
  FScanner *sc_local;
  
  FScanner::MustGetStringName(sc,"{");
  while (bVar1 = FScanner::CheckString(sc,"}"), ((bVar1 ^ 0xffU) & 1) != 0) {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"else");
    if (bVar1) {
      SkipSubBlock(sc);
    }
    else {
      bVar1 = FScanner::Compare(sc,"ifgame");
      if (bVar1) {
        bVar1 = CheckSkipGameBlock(sc);
        if (!bVar1) {
          ParseOptionMenuBody(sc,desc);
        }
      }
      else {
        bVar1 = FScanner::Compare(sc,"ifoption");
        if (bVar1) {
          bVar1 = CheckSkipOptionBlock(sc);
          if (!bVar1) {
            ParseOptionMenuBody(sc,desc);
          }
        }
        else {
          bVar1 = FScanner::Compare(sc,"Class");
          if (bVar1) {
            FScanner::MustGetString(sc);
            label.Chars = (char *)PClass::FindClass(sc->String);
            if (((PClass *)label.Chars == (PClass *)0x0) ||
               (bVar1 = PClass::IsDescendantOf
                                  ((PClass *)label.Chars,DOptionMenu::RegistrationInfo.MyClass),
               !bVar1)) {
              FScanner::ScriptError(sc,"Unknown menu class \'%s\'",sc->String);
            }
            (desc->super_FMenuDescriptor).mClass = (PClass *)label.Chars;
          }
          else {
            bVar1 = FScanner::Compare(sc,"Title");
            if (bVar1) {
              FScanner::MustGetString(sc);
              FString::operator=(&desc->mTitle,sc->String);
            }
            else {
              bVar1 = FScanner::Compare(sc,"Position");
              if (bVar1) {
                FScanner::MustGetNumber(sc);
                desc->mPosition = sc->Number;
              }
              else {
                bVar1 = FScanner::Compare(sc,"DefaultSelection");
                if (bVar1) {
                  FScanner::MustGetNumber(sc);
                  desc->mSelectedItem = sc->Number;
                }
                else {
                  bVar1 = FScanner::Compare(sc,"ScrollTop");
                  if (bVar1) {
                    FScanner::MustGetNumber(sc);
                    desc->mScrollTop = sc->Number;
                  }
                  else {
                    bVar1 = FScanner::Compare(sc,"Indent");
                    if (bVar1) {
                      FScanner::MustGetNumber(sc);
                      desc->mIndent = sc->Number;
                    }
                    else {
                      bVar1 = FScanner::Compare(sc,"Submenu");
                      if (bVar1) {
                        FScanner::MustGetString(sc);
                        FString::FString(&local_28,sc->String);
                        FScanner::MustGetStringName(sc,",");
                        FScanner::MustGetString(sc);
                        this = (FOptionMenuItemSubmenu *)operator_new(0x28);
                        pcVar2 = FString::operator_cast_to_char_(&local_28);
                        FOptionMenuItemSubmenu::FOptionMenuItemSubmenu(this,pcVar2,sc->String,0);
                        label_1.Chars = (char *)this;
                        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                                  (&(desc->mItems).
                                    super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                                   (FOptionMenuItem **)&label_1);
                        FString::~FString(&local_28);
                      }
                      else {
                        bVar1 = FScanner::Compare(sc,"Option");
                        if (bVar1) {
                          FScanner::MustGetString(sc);
                          FString::FString(&cvar,sc->String);
                          FScanner::MustGetStringName(sc,",");
                          FScanner::MustGetString(sc);
                          FString::FString(&values,sc->String);
                          FScanner::MustGetStringName(sc,",");
                          FScanner::MustGetString(sc);
                          FString::FString(&check,sc->String);
                          FString::FString((FString *)&stack0xffffffffffffffa0);
                          it_1._4_4_ = 0;
                          bVar1 = FScanner::CheckString(sc,",");
                          if (bVar1) {
                            FScanner::MustGetString(sc);
                            if (*sc->String != '\0') {
                              FString::operator=((FString *)&stack0xffffffffffffffa0,sc->String);
                            }
                            bVar1 = FScanner::CheckString(sc,",");
                            if (bVar1) {
                              FScanner::MustGetNumber(sc);
                              it_1._4_4_ = sc->Number;
                            }
                          }
                          this_00 = (FOptionMenuItemOption *)operator_new(0x40);
                          pcVar2 = FString::operator_cast_to_char_(&cvar);
                          pcVar3 = FString::operator_cast_to_char_(&values);
                          pcVar4 = FString::operator_cast_to_char_(&check);
                          graycheck = FString::operator_cast_to_char_
                                                ((FString *)&stack0xffffffffffffffa0);
                          FOptionMenuItemOption::FOptionMenuItemOption
                                    (this_00,pcVar2,pcVar3,pcVar4,graycheck,it_1._4_4_);
                          label_2.Chars = (char *)this_00;
                          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                                    (&(desc->mItems).
                                      super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                                     (FOptionMenuItem **)&label_2);
                          FString::~FString((FString *)&stack0xffffffffffffffa0);
                          FString::~FString(&check);
                          FString::~FString(&values);
                          FString::~FString(&cvar);
                        }
                        else {
                          bVar1 = FScanner::Compare(sc,"Command");
                          if (bVar1) {
                            FScanner::MustGetString(sc);
                            FString::FString((FString *)&it_2,sc->String);
                            FScanner::MustGetStringName(sc,",");
                            FScanner::MustGetString(sc);
                            this_01 = (FOptionMenuItemCommand *)operator_new(0x28);
                            pcVar2 = FString::operator_cast_to_char_((FString *)&it_2);
                            FOptionMenuItemCommand::FOptionMenuItemCommand
                                      (this_01,pcVar2,sc->String);
                            label_3.Chars = (char *)this_01;
                            TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                                      (&(desc->mItems).
                                        super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                                       (FOptionMenuItem **)&label_3);
                            FString::~FString((FString *)&it_2);
                          }
                          else {
                            bVar1 = FScanner::Compare(sc,"SafeCommand");
                            if (bVar1) {
                              FScanner::MustGetString(sc);
                              FString::FString(&command,sc->String);
                              FScanner::MustGetStringName(sc,",");
                              FScanner::MustGetString(sc);
                              FString::FString(&prompt,sc->String);
                              FString::FString((FString *)&it_3);
                              bVar1 = FScanner::CheckString(sc,",");
                              if (bVar1) {
                                FScanner::MustGetString(sc);
                                FString::operator=((FString *)&it_3,sc->String);
                              }
                              this_02 = (FOptionMenuItemSafeCommand *)operator_new(0x30);
                              pcVar2 = FString::operator_cast_to_char_(&command);
                              pcVar3 = FString::operator_cast_to_char_(&prompt);
                              pcVar4 = FString::operator_cast_to_char_((FString *)&it_3);
                              FOptionMenuItemSafeCommand::FOptionMenuItemSafeCommand
                                        (this_02,pcVar2,pcVar3,pcVar4);
                              pFStack_a0 = this_02;
                              TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                                        (&(desc->mItems).
                                          super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                                         (FOptionMenuItem **)&stack0xffffffffffffff60);
                              FString::~FString((FString *)&it_3);
                              FString::~FString(&prompt);
                              FString::~FString(&command);
                            }
                            else {
                              bVar1 = FScanner::Compare(sc,"Control");
                              if ((bVar1) || (bVar1 = FScanner::Compare(sc,"MapControl"), bVar1)) {
                                label_4.Chars._7_1_ = FScanner::Compare(sc,"MapControl");
                                FScanner::MustGetString(sc);
                                FString::FString((FString *)&it_4,sc->String);
                                FScanner::MustGetStringName(sc,",");
                                FScanner::MustGetString(sc);
                                this_03 = (FOptionMenuItemControl *)operator_new(0x38);
                                pcVar2 = FString::operator_cast_to_char_((FString *)&it_4);
                                bindings = &Bindings;
                                if ((label_4.Chars._7_1_ & 1) != 0) {
                                  bindings = &AutomapBindings;
                                }
                                FOptionMenuItemControl::FOptionMenuItemControl
                                          (this_03,pcVar2,sc->String,bindings);
                                label_5.Chars = (char *)this_03;
                                TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                                          (&(desc->mItems).
                                            super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                                           (FOptionMenuItem **)&label_5);
                                FString::~FString((FString *)&it_4);
                              }
                              else {
                                bVar1 = FScanner::Compare(sc,"ColorPicker");
                                if (bVar1) {
                                  FScanner::MustGetString(sc);
                                  FString::FString((FString *)&it_5,sc->String);
                                  FScanner::MustGetStringName(sc,",");
                                  FScanner::MustGetString(sc);
                                  this_04 = (FOptionMenuItemColorPicker *)operator_new(0x30);
                                  pcVar2 = FString::operator_cast_to_char_((FString *)&it_5);
                                  FOptionMenuItemColorPicker::FOptionMenuItemColorPicker
                                            (this_04,pcVar2,sc->String);
                                  label_6.Chars = (char *)this_04;
                                  TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                                            (&(desc->mItems).
                                              super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                                             (FOptionMenuItem **)&label_6);
                                  FString::~FString((FString *)&it_5);
                                }
                                else {
                                  bVar1 = FScanner::Compare(sc,"StaticText");
                                  if (bVar1) {
                                    FScanner::MustGetString(sc);
                                    FString::FString((FString *)&stack0xffffffffffffff30,sc->String)
                                    ;
                                    cr_00 = ParseOptionColor(sc,desc);
                                    this_05 = (FOptionMenuItemStaticText *)operator_new(0x28);
                                    pcVar2 = FString::operator_cast_to_char_
                                                       ((FString *)&stack0xffffffffffffff30);
                                    FOptionMenuItemStaticText::FOptionMenuItemStaticText
                                              (this_05,pcVar2,cr_00);
                                    label_7.Chars = (char *)this_05;
                                    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                                              (&(desc->mItems).
                                                super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                                               (FOptionMenuItem **)&label_7);
                                    FString::~FString((FString *)&stack0xffffffffffffff30);
                                  }
                                  else {
                                    bVar1 = FScanner::Compare(sc,"StaticTextSwitchable");
                                    if (bVar1) {
                                      FScanner::MustGetString(sc);
                                      FString::FString(&label2,sc->String);
                                      FScanner::MustGetStringName(sc,",");
                                      FScanner::MustGetString(sc);
                                      FString::FString((FString *)&cr_1,sc->String);
                                      FScanner::MustGetStringName(sc,",");
                                      FScanner::MustGetString(sc);
                                      FName::FName((FName *)((long)&it_7 + 4),sc->String);
                                      it_7._0_4_ = ParseOptionColor(sc,desc);
                                      this_06 = (FOptionMenuItemStaticTextSwitchable *)
                                                operator_new(0x38);
                                      pcVar2 = FString::operator_cast_to_char_(&label2);
                                      pcVar3 = FString::operator_cast_to_char_((FString *)&cr_1);
                                      FName::FName((FName *)((long)&text.Chars + 4),
                                                   (FName *)((long)&it_7 + 4));
                                      FOptionMenuItemStaticTextSwitchable::
                                      FOptionMenuItemStaticTextSwitchable
                                                (this_06,pcVar2,pcVar3,
                                                 (FName *)((long)&text.Chars + 4),(EColorRange)it_7)
                                      ;
                                      local_100 = this_06;
                                      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                                                (&(desc->mItems).
                                                  super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>
                                                 ,(FOptionMenuItem **)&local_100);
                                      FString::~FString((FString *)&cr_1);
                                      FString::~FString(&label2);
                                    }
                                    else {
                                      bVar1 = FScanner::Compare(sc,"Slider");
                                      if (bVar1) {
                                        FScanner::MustGetString(sc);
                                        FString::FString(&action_1,sc->String);
                                        FScanner::MustGetStringName(sc,",");
                                        FScanner::MustGetString(sc);
                                        FString::FString((FString *)&min,sc->String);
                                        FScanner::MustGetStringName(sc,",");
                                        FScanner::MustGetFloat(sc);
                                        max = sc->Float;
                                        FScanner::MustGetStringName(sc,",");
                                        FScanner::MustGetFloat(sc);
                                        step = sc->Float;
                                        FScanner::MustGetStringName(sc,",");
                                        FScanner::MustGetFloat(sc);
                                        dStack_130 = sc->Float;
                                        it_8._4_4_ = 1;
                                        bVar1 = FScanner::CheckString(sc,",");
                                        if (bVar1) {
                                          FScanner::MustGetNumber(sc);
                                          it_8._4_4_ = sc->Number;
                                        }
                                        this_07 = (FOptionMenuSliderCVar *)operator_new(0x58);
                                        pcVar2 = FString::operator_cast_to_char_(&action_1);
                                        pcVar3 = FString::operator_cast_to_char_((FString *)&min);
                                        FOptionMenuSliderCVar::FOptionMenuSliderCVar
                                                  (this_07,pcVar2,pcVar3,max,step,dStack_130,
                                                   it_8._4_4_);
                                        it_9 = (FOptionMenuItem *)this_07;
                                        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                                                  (&(desc->mItems).
                                                                                                        
                                                  super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>
                                                  ,&it_9);
                                        FString::~FString((FString *)&min);
                                        FString::~FString(&action_1);
                                      }
                                      else {
                                        bVar1 = FScanner::Compare(sc,"screenresolution");
                                        if (bVar1) {
                                          FScanner::MustGetString(sc);
                                          this_08 = (FOptionMenuScreenResolutionLine *)
                                                    operator_new(0x50);
                                          FOptionMenuScreenResolutionLine::
                                          FOptionMenuScreenResolutionLine(this_08,sc->String);
                                          label_8.Chars = (char *)this_08;
                                          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                                                    (&(desc->mItems).
                                                                                                            
                                                  super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>
                                                  ,(FOptionMenuItem **)&label_8);
                                        }
                                        else {
                                          bVar1 = FScanner::Compare(sc,"TextField");
                                          if (bVar1) {
                                            FScanner::MustGetString(sc);
                                            FString::FString(&cvar_1,sc->String);
                                            FScanner::MustGetStringName(sc,",");
                                            FScanner::MustGetString(sc);
                                            FString::FString(&check_1,sc->String);
                                            FString::FString((FString *)&it_10);
                                            bVar1 = FScanner::CheckString(sc,",");
                                            if (bVar1) {
                                              FScanner::MustGetString(sc);
                                              FString::operator=((FString *)&it_10,sc->String);
                                            }
                                            this_09 = (FOptionMenuTextField *)operator_new(0xc0);
                                            pcVar2 = FString::operator_cast_to_char_(&cvar_1);
                                            pcVar3 = FString::operator_cast_to_char_(&check_1);
                                            pcVar4 = FString::operator_cast_to_char_
                                                               ((FString *)&it_10);
                                            FOptionMenuTextField::FOptionMenuTextField
                                                      (this_09,pcVar2,pcVar3,pcVar4);
                                            label_9.Chars = (char *)this_09;
                                            TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                                                      (&(desc->mItems).
                                                                                                                
                                                  super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>
                                                  ,(FOptionMenuItem **)&label_9);
                                            FString::~FString((FString *)&it_10);
                                            FString::~FString(&check_1);
                                            FString::~FString(&cvar_1);
                                          }
                                          else {
                                            bVar1 = FScanner::Compare(sc,"NumberField");
                                            if (bVar1) {
                                              FScanner::MustGetString(sc);
                                              FString::FString(&cvar_2,sc->String);
                                              FScanner::MustGetStringName(sc,",");
                                              FScanner::MustGetString(sc);
                                              FString::FString((FString *)&maximum,sc->String);
                                              step_1 = 0.0;
                                              local_180 = 100.0;
                                              check_2.Chars._4_4_ = 1.0;
                                              FString::FString((FString *)&it_11);
                                              bVar1 = FScanner::CheckString(sc,",");
                                              if (bVar1) {
                                                FScanner::MustGetFloat(sc);
                                                step_1 = (float)sc->Float;
                                                FScanner::MustGetStringName(sc,",");
                                                FScanner::MustGetFloat(sc);
                                                local_180 = (float)sc->Float;
                                                bVar1 = FScanner::CheckString(sc,",");
                                                if (bVar1) {
                                                  FScanner::MustGetFloat(sc);
                                                  check_2.Chars._4_4_ = (float)sc->Float;
                                                  bVar1 = FScanner::CheckString(sc,",");
                                                  if (bVar1) {
                                                    FScanner::MustGetString(sc);
                                                    FString::operator=((FString *)&it_11,sc->String)
                                                    ;
                                                  }
                                                }
                                              }
                                              this_10 = (FOptionMenuNumberField *)operator_new(0x48)
                                              ;
                                              pcVar2 = FString::operator_cast_to_char_(&cvar_2);
                                              pcVar3 = FString::operator_cast_to_char_
                                                                 ((FString *)&maximum);
                                              step_00 = check_2.Chars._4_4_;
                                              pcVar4 = FString::operator_cast_to_char_
                                                                 ((FString *)&it_11);
                                              FOptionMenuNumberField::FOptionMenuNumberField
                                                        (this_10,pcVar2,pcVar3,step_1,local_180,
                                                         step_00,pcVar4);
                                              local_198 = this_10;
                                              TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                                                        (&(desc->mItems).
                                                                                                                    
                                                  super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>
                                                  ,(FOptionMenuItem **)&local_198);
                                              FString::~FString((FString *)&it_11);
                                              FString::~FString((FString *)&maximum);
                                              FString::~FString(&cvar_2);
                                            }
                                            else {
                                              FScanner::ScriptError
                                                        (sc,"Unknown keyword \'%s\'",sc->String);
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ParseOptionMenuBody(FScanner &sc, FOptionMenuDescriptor *desc)
{
	sc.MustGetStringName("{");
	while (!sc.CheckString("}"))
	{
		sc.MustGetString();
		if (sc.Compare("else"))
		{
			SkipSubBlock(sc);
		}
		else if (sc.Compare("ifgame"))
		{
			if (!CheckSkipGameBlock(sc))
			{
				// recursively parse sub-block
				ParseOptionMenuBody(sc, desc);
			}
		}
		else if (sc.Compare("ifoption"))
		{
			if (!CheckSkipOptionBlock(sc))
			{
				// recursively parse sub-block
				ParseOptionMenuBody(sc, desc);
			}
		}
		else if (sc.Compare("Class"))
		{
			sc.MustGetString();
			const PClass *cls = PClass::FindClass(sc.String);
			if (cls == NULL || !cls->IsDescendantOf(RUNTIME_CLASS(DOptionMenu)))
			{
				sc.ScriptError("Unknown menu class '%s'", sc.String);
			}
			desc->mClass = cls;
		}
		else if (sc.Compare("Title"))
		{
			sc.MustGetString();
			desc->mTitle = sc.String;
		}
		else if (sc.Compare("Position"))
		{
			sc.MustGetNumber();
			desc->mPosition = sc.Number;
		}
		else if (sc.Compare("DefaultSelection"))
		{
			sc.MustGetNumber();
			desc->mSelectedItem = sc.Number;
		}
		else if (sc.Compare("ScrollTop"))
		{
			sc.MustGetNumber();
			desc->mScrollTop = sc.Number;
		}
		else if (sc.Compare("Indent"))
		{
			sc.MustGetNumber();
			desc->mIndent = sc.Number;
		}
		else if (sc.Compare("Submenu"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FOptionMenuItem *it = new FOptionMenuItemSubmenu(label, sc.String);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("Option"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FString cvar = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FString values = sc.String;
			FString check;
			int center = 0;
			if (sc.CheckString(","))
			{
				sc.MustGetString();
				if (*sc.String != 0) check = sc.String;
				if (sc.CheckString(","))
				{
					sc.MustGetNumber();
					center = sc.Number;
				}
			}
			FOptionMenuItem *it = new FOptionMenuItemOption(label, cvar, values, check, center);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("Command"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FOptionMenuItem *it = new FOptionMenuItemCommand(label, sc.String);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("SafeCommand"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FString command = sc.String;
			FString prompt;
			// Check for optional custom prompt
			if (sc.CheckString(","))
			{
				sc.MustGetString();
				prompt = sc.String;
			}
			FOptionMenuItem *it = new FOptionMenuItemSafeCommand(label, command, prompt);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("Control") || sc.Compare("MapControl"))
		{
			bool map = sc.Compare("MapControl");
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FOptionMenuItem *it = new FOptionMenuItemControl(label, sc.String, map? &AutomapBindings : &Bindings);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("ColorPicker"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FOptionMenuItem *it = new FOptionMenuItemColorPicker(label, sc.String);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("StaticText"))
		{
			sc.MustGetString();
			FString label = sc.String;
			EColorRange cr = ParseOptionColor(sc, desc);
			FOptionMenuItem *it = new FOptionMenuItemStaticText(label, cr);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("StaticTextSwitchable"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FString label2 = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FName action = sc.String;
			EColorRange cr = ParseOptionColor(sc, desc);
			FOptionMenuItem *it = new FOptionMenuItemStaticTextSwitchable(label, label2, action, cr);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("Slider"))
		{
			sc.MustGetString();
			FString text = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FString action = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetFloat();
			double min = sc.Float;
			sc.MustGetStringName(",");
			sc.MustGetFloat();
			double max = sc.Float;
			sc.MustGetStringName(",");
			sc.MustGetFloat();
			double step = sc.Float;
			int showvalue = 1;
			if (sc.CheckString(","))
			{
				sc.MustGetNumber();
				showvalue = sc.Number;
			}
			FOptionMenuItem *it = new FOptionMenuSliderCVar(text, action, min, max, step, showvalue);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("screenresolution"))
		{
			sc.MustGetString();
			FOptionMenuItem *it = new FOptionMenuScreenResolutionLine(sc.String);
			desc->mItems.Push(it);
		}
		// [TP] -- Text input widget
		else if ( sc.Compare( "TextField" ))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName( "," );
			sc.MustGetString();
			FString cvar = sc.String;
			FString check;
			
			if ( sc.CheckString( "," ))
			{
				sc.MustGetString();
				check = sc.String;
			}

			FOptionMenuItem* it = new FOptionMenuTextField( label, cvar, check );
			desc->mItems.Push( it );
		}
		// [TP] -- Number input widget
		else if ( sc.Compare( "NumberField" ))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName( "," );
			sc.MustGetString();
			FString cvar = sc.String;
			float minimum = 0.0f;
			float maximum = 100.0f;
			float step = 1.0f;
			FString check;

			if ( sc.CheckString( "," ))
			{
				sc.MustGetFloat();
				minimum = (float) sc.Float;
				sc.MustGetStringName( "," );
				sc.MustGetFloat();
				maximum = (float) sc.Float;

				if ( sc.CheckString( "," ))
				{
					sc.MustGetFloat();
					step = (float) sc.Float;

					if ( sc.CheckString( "," ))
					{
						sc.MustGetString();
						check = sc.String;
					}
				}
			}

			FOptionMenuItem* it = new FOptionMenuNumberField( label, cvar,
				minimum, maximum, step, check );
			desc->mItems.Push( it );
		}
		else
		{
			sc.ScriptError("Unknown keyword '%s'", sc.String);
		}
	}
}